

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O2

void phits_set_stdout(FILE *fh)

{
  fflush(_stdout);
  fflush(_stderr);
  if (phits_impl_stdout_data::thefh != (FILE *)0x0) {
    fflush((FILE *)phits_impl_stdout_data::thefh);
  }
  if (fh != (FILE *)0x0) {
    fflush((FILE *)fh);
  }
  phits_impl_stdout_data::thefh = fh;
  return;
}

Assistant:

void phits_set_stdout( FILE* fh )
{
  fflush(stdout);
  fflush(stderr);
  FILE** fhptr = phits_impl_stdout_data();
  if (*fhptr)
    fflush(*fhptr);
  if (fh)
    fflush(fh);
  *fhptr = fh;
}